

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_adapt.c
# Opt level: O1

ARKodeHAdaptMem arkAdaptInit(void)

{
  ARKodeHAdaptMem __s;
  
  __s = (ARKodeHAdaptMem)malloc(0xe0);
  if (__s == (ARKodeHAdaptMem)0x0) {
    __s = (ARKodeHAdaptMem)0x0;
  }
  else {
    memset(__s,0,0xe0);
    __s->ehist[0] = 1.0;
    __s->ehist[1] = 1.0;
    __s->hhist[0] = 0.0;
    __s->hhist[1] = 0.0;
    __s->nst_acc = 0;
    __s->nst_exp = 0;
  }
  return __s;
}

Assistant:

ARKodeHAdaptMem arkAdaptInit()
{
  ARKodeHAdaptMem hadapt_mem;

  /* allocate structure */
  hadapt_mem = (ARKodeHAdaptMem) malloc(sizeof(struct ARKodeHAdaptMemRec));
  if (hadapt_mem == NULL)  return(NULL);

  /* initialize values (default parameters are set in arkSetDefaults) */
  memset(hadapt_mem, 0, sizeof(struct ARKodeHAdaptMemRec));
  hadapt_mem->ehist[0] = ONE;
  hadapt_mem->ehist[1] = ONE;
  hadapt_mem->hhist[0] = ZERO;
  hadapt_mem->hhist[1] = ZERO;
  hadapt_mem->nst_acc  = 0;
  hadapt_mem->nst_exp  = 0;
  return(hadapt_mem);
}